

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_map_constructor(JSContext *ctx,JSValue new_target,int argc,JSValue *argv,int magic)

{
  JSValue new_target_00;
  JSValue new_target_01;
  bool bVar1;
  JSValueUnion JVar2;
  int iVar3;
  JSValueUnion JVar4;
  uint *puVar5;
  void *pvVar6;
  JSValueUnion JVar8;
  JSAtom prop;
  ulong uVar9;
  uint uVar10;
  int64_t iVar11;
  undefined4 in_register_0000008c;
  int64_t iVar12;
  ulong uVar13;
  JSValue func_obj;
  JSValue v;
  JSValue v_00;
  JSValue func_obj_00;
  JSValue v_01;
  JSValue JVar14;
  JSValue val;
  JSValue obj;
  JSValue JVar15;
  JSValue v_02;
  JSValue JVar16;
  BOOL done;
  undefined4 uVar17;
  uint in_stack_fffffffffffffefc;
  BOOL *in_stack_ffffffffffffff00;
  JSValueUnion local_c8;
  JSValue local_b8;
  int64_t local_a8;
  int local_9c;
  JSValueUnion local_98;
  int64_t iStack_90;
  JSValue local_88;
  JSValue local_70;
  JSValueUnion local_60;
  int64_t local_58;
  ulong local_50;
  JSValueUnion local_48;
  undefined4 local_40;
  uint uStack_3c;
  undefined8 uStack_38;
  JSValueUnion JVar7;
  
  local_50 = CONCAT44(in_register_0000008c,magic);
  JVar14 = js_create_from_ctor(ctx,new_target,magic + 0x1f);
  JVar4 = JVar14.u;
  uVar10 = (uint)JVar14.tag;
  if (uVar10 != 6) {
    puVar5 = (uint *)js_mallocz(ctx,0x30);
    if (puVar5 == (uint *)0x0) {
      JVar15 = (JSValue)(ZEXT816(3) << 0x40);
      val = (JSValue)(ZEXT816(3) << 0x40);
      obj = (JSValue)(ZEXT816(3) << 0x40);
    }
    else {
      *(uint **)(puVar5 + 2) = puVar5 + 2;
      *(uint **)(puVar5 + 4) = puVar5 + 2;
      *puVar5 = (uint)(local_50 >> 1) & 1;
      if (uVar10 == 0xffffffff) {
        *(uint **)((long)JVar4.ptr + 0x30) = puVar5;
      }
      puVar5[10] = 1;
      local_98 = JVar4;
      pvVar6 = js_malloc(ctx,0x10);
      *(void **)(puVar5 + 8) = pvVar6;
      if (pvVar6 != (void *)0x0) {
        *(void **)pvVar6 = pvVar6;
        *(void **)((long)pvVar6 + 8) = pvVar6;
        puVar5[0xb] = 4;
        if (argc < 1) {
          iVar11 = 3;
          JVar8.float64 = 0.0;
        }
        else {
          JVar8 = (JSValueUnion)(argv->u).ptr;
          iVar11 = argv->tag;
        }
        if (((uint)iVar11 & 0xfffffffe) != 2) {
          prop = 0x68;
          if ((local_50 & 1) == 0) {
            prop = 0x42;
          }
          val = JS_GetPropertyInternal(ctx,JVar14,prop,JVar14,0);
          JVar7 = val.u;
          iVar12 = 2;
          if ((int)val.tag == 6) {
            JVar15 = (JSValue)(ZEXT816(3) << 0x40);
            obj = (JSValue)(ZEXT816(3) << 0x40);
          }
          else {
            local_a8 = val.tag;
            iVar3 = JS_IsFunction(ctx,val);
            if (iVar3 == 0) {
              JS_ThrowTypeError(ctx,"set/add is not a function");
              val.tag = local_a8;
              val.u.ptr = JVar7.ptr;
              obj = (JSValue)(ZEXT816(3) << 0x40);
              JVar15 = (JSValue)(ZEXT816(3) << 0x40);
            }
            else {
              JVar15.tag = iVar11;
              JVar15.u.float64 = JVar8.float64;
              obj = JS_GetIterator(ctx,JVar15,0);
              val.tag = local_a8;
              val.u.ptr = JVar7.ptr;
              JVar8 = obj.u;
              if ((int)obj.tag == 6) {
                JVar15 = (JSValue)(ZEXT816(3) << 0x40);
              }
              else {
                uVar17 = 0;
                JVar15 = JS_GetPropertyInternal(ctx,obj,0x6a,obj,0);
                iVar11 = local_a8;
                val.tag = local_a8;
                if ((int)JVar15.tag != 6) {
                  local_b8 = JS_IteratorNext(ctx,obj,JVar15,(int)&local_9c,
                                             (JSValue *)CONCAT44(in_stack_fffffffffffffefc,uVar17),
                                             in_stack_ffffffffffffff00);
                  uVar13 = local_b8.tag;
                  JVar2 = local_98;
                  while( true ) {
                    iVar12 = 2;
                    local_98 = JVar2;
                    if ((uVar13 & 0xffffffff) == 6) break;
                    val.tag = iVar11;
                    if (local_9c != 0) {
                      JS_FreeValue(ctx,local_b8);
                      JS_FreeValue(ctx,JVar15);
                      JS_FreeValue(ctx,obj);
                      v_01.tag = iVar11;
                      v_01.u.ptr = JVar7.ptr;
                      JS_FreeValue(ctx,v_01);
                      iVar12 = 0;
                      goto LAB_00130799;
                    }
                    if ((local_50 & 1) == 0) {
                      if ((uVar13 & 0xffffffff) == 0xffffffff) {
                        _local_60 = JS_GetPropertyValue(ctx,local_b8,(JSValue)ZEXT816(0));
                        uVar13 = (ulong)local_60.ptr >> 0x20;
                        if (local_60._8_4_ == 6) goto LAB_001309ee;
                        local_70 = JS_GetPropertyValue(ctx,local_b8,(JSValue)ZEXT816(1));
                        JVar16.tag = (int64_t)JVar8.ptr;
                        JVar16.u.ptr = local_48.ptr;
                        uVar9 = (ulong)local_70.u.ptr >> 0x20;
                        if ((int)local_70.tag == 6) goto LAB_001309f6;
                        local_98 = local_60;
                        iStack_90 = local_58;
                        local_40 = 0;
                        uStack_38 = 3;
                        uVar17 = 0;
                        in_stack_ffffffffffffff00 = (BOOL *)0x3;
                        new_target_01.tag = 3;
                        new_target_01.u.ptr = (void *)((ulong)uStack_3c << 0x20);
                        func_obj_00.tag = local_a8;
                        func_obj_00.u.ptr = JVar7.ptr;
                        in_stack_fffffffffffffefc = uStack_3c;
                        local_88 = local_70;
                        JVar16 = JS_CallInternal(ctx,func_obj_00,JVar14,new_target_01,2,
                                                 (JSValue *)&local_98,2);
                        iVar11 = JVar16.tag;
                        local_48 = JVar16.u;
                        if ((int)JVar16.tag == 6) goto LAB_001309f6;
                        JS_FreeValue(ctx,_local_60);
                        JS_FreeValue(ctx,local_70);
                        iVar12 = 0;
                        bVar1 = true;
                      }
                      else {
                        JS_ThrowTypeError(ctx,"not an object");
                        uVar13 = 0;
                        _local_60 = (JSValue)(ZEXT816(3) << 0x40);
LAB_001309ee:
                        JVar16.tag = (int64_t)JVar8.ptr;
                        JVar16.u.ptr = local_48.ptr;
                        uVar9 = 0;
                        local_70 = (JSValue)(ZEXT816(3) << 0x40);
LAB_001309f6:
                        iVar11 = JVar16.tag;
                        local_48 = JVar16.u;
                        JS_FreeValue(ctx,local_b8);
                        v.u.ptr = (void *)((ulong)(uint)local_60._0_4_ | uVar13 << 0x20);
                        v.tag = local_58;
                        JS_FreeValue(ctx,v);
                        v_00.u.ptr = (void *)((ulong)(uint)local_70.u._0_4_ | uVar9 << 0x20);
                        v_00.tag = local_70.tag;
                        JS_FreeValue(ctx,v_00);
                        iVar12 = 2;
                        bVar1 = false;
                      }
                      v_02.tag = iVar11;
                      v_02.u.float64 = local_48.float64;
                      iVar11 = local_a8;
                      if (!bVar1) break;
                    }
                    else {
                      local_98.float64 = JVar2.float64 & 0xffffffff00000000;
                      iStack_90 = 3;
                      uVar17 = 0;
                      in_stack_fffffffffffffefc = JVar2._4_4_;
                      in_stack_ffffffffffffff00 = (BOOL *)0x3;
                      new_target_00.tag = 3;
                      new_target_00.u.ptr = (void *)((ulong)in_stack_fffffffffffffefc << 0x20);
                      func_obj.tag = iVar11;
                      func_obj.u.ptr = JVar7.ptr;
                      v_02 = JS_CallInternal(ctx,func_obj,JVar14,new_target_00,1,&local_b8,2);
                      if ((int)v_02.tag == 6) {
                        JS_FreeValue(ctx,local_b8);
                        iVar12 = 2;
                        break;
                      }
                    }
                    JVar8 = (JSValueUnion)v_02.tag;
                    local_48 = v_02.u;
                    JS_FreeValue(ctx,v_02);
                    JS_FreeValue(ctx,local_b8);
                    local_b8 = JS_IteratorNext(ctx,obj,JVar15,(int)&local_9c,
                                               (JSValue *)CONCAT44(in_stack_fffffffffffffefc,uVar17)
                                               ,in_stack_ffffffffffffff00);
                    uVar13 = local_b8.tag;
                    JVar2 = local_98;
                  }
                  val.tag = iVar11;
                }
              }
            }
          }
LAB_00130799:
          if ((int)iVar12 == 2) goto LAB_001307c7;
          if ((int)iVar12 != 0) {
            uVar13 = 0;
            uVar9 = 0;
            goto LAB_001308d5;
          }
        }
        uVar9 = (ulong)JVar4.ptr & 0xffffffff00000000;
        uVar13 = (ulong)JVar4.ptr & 0xffffffff;
        iVar12 = JVar14.tag;
        goto LAB_001308d5;
      }
      obj = (JSValue)(ZEXT816(3) << 0x40);
      val = (JSValue)(ZEXT816(3) << 0x40);
      JVar15 = (JSValue)(ZEXT816(3) << 0x40);
    }
LAB_001307c7:
    local_c8 = val.u;
    JVar8 = obj.u;
    if ((uint)obj.tag == 0xffffffff) {
      JS_IteratorClose(ctx,obj,1);
    }
    local_98 = JVar15.u;
    if ((0xfffffff4 < (uint)JVar15.tag) &&
       (iVar3 = *local_98.ptr, *(int *)local_98.ptr = iVar3 + -1, iVar3 < 2)) {
      __JS_FreeValueRT(ctx->rt,JVar15);
    }
    if ((0xfffffff4 < (uint)obj.tag) &&
       (iVar3 = *JVar8.ptr, *(int *)JVar8.ptr = iVar3 + -1, iVar3 < 2)) {
      local_98 = JVar8;
      __JS_FreeValueRT(ctx->rt,obj);
    }
    local_98.float64 = local_c8.float64;
    if ((0xfffffff4 < (uint)val.tag) &&
       (iVar3 = *local_c8.ptr, *(int *)local_c8.ptr = iVar3 + -1, iVar3 < 2)) {
      __JS_FreeValueRT(ctx->rt,val);
    }
    if ((0xfffffff4 < uVar10) && (iVar3 = *JVar4.ptr, *(int *)JVar4.ptr = iVar3 + -1, iVar3 < 2)) {
      local_98 = JVar4;
      __JS_FreeValueRT(ctx->rt,JVar14);
    }
  }
  iVar12 = 6;
  uVar13 = 0;
  uVar9 = 0;
LAB_001308d5:
  JVar14.u.ptr = (void *)(uVar13 | uVar9);
  JVar14.tag = iVar12;
  return JVar14;
}

Assistant:

static JSValue js_map_constructor(JSContext *ctx, JSValueConst new_target,
                                  int argc, JSValueConst *argv, int magic)
{
    JSMapState *s;
    JSValue obj, adder = JS_UNDEFINED, iter = JS_UNDEFINED, next_method = JS_UNDEFINED;
    JSValueConst arr;
    BOOL is_set, is_weak;

    is_set = magic & MAGIC_SET;
    is_weak = ((magic & MAGIC_WEAK) != 0);
    obj = js_create_from_ctor(ctx, new_target, JS_CLASS_MAP + magic);
    if (JS_IsException(obj))
        return JS_EXCEPTION;
    s = js_mallocz(ctx, sizeof(*s));
    if (!s)
        goto fail;
    init_list_head(&s->records);
    s->is_weak = is_weak;
    JS_SetOpaque(obj, s);
    s->hash_size = 1;
    s->hash_table = js_malloc(ctx, sizeof(s->hash_table[0]) * s->hash_size);
    if (!s->hash_table)
        goto fail;
    init_list_head(&s->hash_table[0]);
    s->record_count_threshold = 4;

    arr = JS_UNDEFINED;
    if (argc > 0)
        arr = argv[0];
    if (!JS_IsUndefined(arr) && !JS_IsNull(arr)) {
        JSValue item, ret;
        BOOL done;

        adder = JS_GetProperty(ctx, obj, is_set ? JS_ATOM_add : JS_ATOM_set);
        if (JS_IsException(adder))
            goto fail;
        if (!JS_IsFunction(ctx, adder)) {
            JS_ThrowTypeError(ctx, "set/add is not a function");
            goto fail;
        }

        iter = JS_GetIterator(ctx, arr, FALSE);
        if (JS_IsException(iter))
            goto fail;
        next_method = JS_GetProperty(ctx, iter, JS_ATOM_next);
        if (JS_IsException(next_method))
            goto fail;

        for(;;) {
            item = JS_IteratorNext(ctx, iter, next_method, 0, NULL, &done);
            if (JS_IsException(item))
                goto fail;
            if (done) {
                JS_FreeValue(ctx, item);
                break;
            }
            if (is_set) {
                ret = JS_Call(ctx, adder, obj, 1, (JSValueConst *)&item);
                if (JS_IsException(ret)) {
                    JS_FreeValue(ctx, item);
                    goto fail;
                }
            } else {
                JSValue key, value;
                JSValueConst args[2];
                key = JS_UNDEFINED;
                value = JS_UNDEFINED;
                if (!JS_IsObject(item)) {
                    JS_ThrowTypeErrorNotAnObject(ctx);
                    goto fail1;
                }
                key = JS_GetPropertyUint32(ctx, item, 0);
                if (JS_IsException(key))
                    goto fail1;
                value = JS_GetPropertyUint32(ctx, item, 1);
                if (JS_IsException(value))
                    goto fail1;
                args[0] = key;
                args[1] = value;
                ret = JS_Call(ctx, adder, obj, 2, args);
                if (JS_IsException(ret)) {
                fail1:
                    JS_FreeValue(ctx, item);
                    JS_FreeValue(ctx, key);
                    JS_FreeValue(ctx, value);
                    goto fail;
                }
                JS_FreeValue(ctx, key);
                JS_FreeValue(ctx, value);
            }
            JS_FreeValue(ctx, ret);
            JS_FreeValue(ctx, item);
        }
        JS_FreeValue(ctx, next_method);
        JS_FreeValue(ctx, iter);
        JS_FreeValue(ctx, adder);
    }
    return obj;
 fail:
    if (JS_IsObject(iter)) {
        /* close the iterator object, preserving pending exception */
        JS_IteratorClose(ctx, iter, TRUE);
    }
    JS_FreeValue(ctx, next_method);
    JS_FreeValue(ctx, iter);
    JS_FreeValue(ctx, adder);
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}